

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,Model *model,uint32_t indent,
          bool closing_brace)

{
  char *pcVar1;
  string *psVar2;
  bool bVar3;
  ostream *poVar4;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t uVar5;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint32_t n_01;
  uint32_t extraout_EDX_03;
  uint32_t extraout_EDX_04;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokset;
  stringstream ss;
  char local_214;
  undefined1 local_210 [32];
  _Base_ptr local_1f0;
  size_t local_1e8;
  string *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  uVar5 = indent;
  local_1e0 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_((string *)local_210,(pprint *)((ulong)model & 0xffffffff),n);
  poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(char *)local_210._0_8_,CONCAT44(local_210._12_4_,local_210._8_4_));
  to_string_abi_cxx11_(&local_1d8,(tinyusdz *)(ulong)*(uint *)(this + 0xa18),s);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = local_210 + 0x10;
  if ((char *)local_210._0_8_ != pcVar1) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  if (*(long *)(this + 0xa00) != 0) {
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,*(char **)(this + 0x9f8),*(long *)(this + 0xa00));
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," \"",2);
  poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,*(char **)(this + 0x9d8),*(long *)(this + 0x9e0));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"\n",2);
  bVar3 = PrimMetas::authored((PrimMetas *)(this + 0xa28));
  n_01 = n_00;
  if (bVar3) {
    pprint::Indent_abi_cxx11_((string *)local_210,(pprint *)((ulong)model & 0xffffffff),n_00);
    poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_210._0_8_,CONCAT44(local_210._12_4_,local_210._8_4_)
                       );
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(\n",2);
    if ((char *)local_210._0_8_ != pcVar1) {
      operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
    }
    print_prim_metas_abi_cxx11_
              ((string *)local_210,this + 0xa28,(PrimMeta *)(ulong)((int)model + 1),uVar5);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(char *)local_210._0_8_,CONCAT44(local_210._12_4_,local_210._8_4_));
    uVar5 = extraout_EDX;
    if ((char *)local_210._0_8_ != pcVar1) {
      operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
      uVar5 = extraout_EDX_00;
    }
    pprint::Indent_abi_cxx11_((string *)local_210,(pprint *)((ulong)model & 0xffffffff),uVar5);
    poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_210._0_8_,CONCAT44(local_210._12_4_,local_210._8_4_)
                       );
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
    n_01 = extraout_EDX_01;
    if ((char *)local_210._0_8_ != pcVar1) {
      operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
      n_01 = extraout_EDX_02;
    }
  }
  pprint::Indent_abi_cxx11_((string *)local_210,(pprint *)((ulong)model & 0xffffffff),n_01);
  poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(char *)local_210._0_8_,CONCAT44(local_210._12_4_,local_210._8_4_));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{\n",2);
  if ((char *)local_210._0_8_ != pcVar1) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  local_210._24_8_ = local_210 + 8;
  local_210._8_4_ = _S_red;
  local_210._16_8_ = (_Link_type)0x0;
  local_1e8 = 0;
  local_1f0 = (_Base_ptr)local_210._24_8_;
  print_props(&local_1d8,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)(this + 0xe60),
              (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_210,
              (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(this + 0xea8),
              (int)model + 1);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  uVar5 = extraout_EDX_03;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    uVar5 = extraout_EDX_04;
  }
  local_214 = (char)indent;
  if (local_214 != '\0') {
    pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)((ulong)model & 0xffffffff),uVar5);
    poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
  }
  psVar2 = local_1e0;
  ::std::__cxx11::stringbuf::str();
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_210,(_Link_type)local_210._16_8_);
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

std::string to_string(const Model &model, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(model.spec);
  if (model.prim_type_name.size()) {
    ss << " " << model.prim_type_name;
  }
  ss << " \"" << model.name << "\"\n";

  if (model.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(model.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  std::set<std::string> tokset;
  ss << print_props(model.props, tokset, model.propertyNames(), indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}